

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O3

void __thiscall RoboClaw::crc_update(RoboClaw *this,uint8_t data)

{
  ushort uVar1;
  int iVar2;
  ushort uVar3;
  bool bVar4;
  
  uVar3 = (ushort)data << 8 ^ this->m_crc;
  iVar2 = 8;
  do {
    uVar1 = uVar3 * 2;
    bVar4 = -1 < (short)uVar3;
    uVar3 = uVar1 ^ 0x1021;
    if (bVar4) {
      uVar3 = uVar1;
    }
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  this->m_crc = uVar3;
  return;
}

Assistant:

void RoboClaw::crc_update( uint8_t data )
{
    int i;
    m_crc = m_crc ^ ((uint16_t)data << 8);
    for (i=0; i<8; i++)
    {
        if (m_crc & 0x8000)
            m_crc = (m_crc << 1) ^ 0x1021;
        else
            m_crc <<= 1;
    }
}